

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O3

bool sptk::ComputeFirstOrderRegressionCoefficients
               (int n,vector<double,_std::allocator<double>_> *coefficients)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  if (coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n) {
    uVar5 = n * 2 + 1;
    if ((long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (ulong)uVar5) {
      std::vector<double,_std::allocator<double>_>::resize(coefficients,(ulong)uVar5);
    }
    auVar2 = _DAT_00117a90;
    dVar6 = 1.0 / (double)(((n + 1) * n * uVar5) / 3);
    pdVar1 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = n * 2;
    auVar7._4_4_ = 0;
    auVar7._0_4_ = uVar5;
    auVar7._8_4_ = uVar5;
    auVar7._12_4_ = 0;
    iVar4 = -n;
    lVar3 = 0;
    auVar7 = auVar7 ^ _DAT_00117a90;
    auVar8 = _DAT_00117a80;
    do {
      auVar10 = auVar8 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        *(double *)((long)pdVar1 + lVar3) = (double)iVar4 * dVar6;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        *(double *)((long)pdVar1 + lVar3 + 8) = (double)(iVar4 + 1) * dVar6;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar3 = lVar3 + 0x10;
      iVar4 = iVar4 + 2;
    } while ((ulong)uVar5 * 8 + 0x10 != lVar3);
  }
  return coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n;
}

Assistant:

bool ComputeFirstOrderRegressionCoefficients(
    int n, std::vector<double>* coefficients) {
  if (n <= 0 || NULL == coefficients) {
    return false;
  }

  const int a0(2 * n + 1);
  if (coefficients->size() != static_cast<std::size_t>(a0)) {
    coefficients->resize(a0);
  }
  const int a1(a0 * n * (n + 1) / 3);
  const double norm(1.0 / a1);
  for (int j(-n), i(0); j <= n; ++j, ++i) {
    (*coefficients)[i] = j * norm;
  }
  return true;
}